

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall MeterPrivate::drawLabels(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  bool bVar1;
  QFont *pQVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  qreal qVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  qreal qVar13;
  undefined4 uVar14;
  double dVar15;
  undefined4 uVar16;
  QFlags<Qt::AlignmentFlag> local_20c;
  QTextOption local_208 [24];
  QString local_1f0;
  QRectF local_1d8;
  QFont local_1b8 [8];
  QFont f_3;
  QFlags<Qt::AlignmentFlag> local_1a4;
  QTextOption local_1a0 [24];
  QRectF local_188;
  QFont local_168 [8];
  QFont f_2;
  QFlags<Qt::AlignmentFlag> local_154;
  QTextOption local_150 [24];
  QRectF local_138;
  QFont local_118 [8];
  QFont f_1;
  int y_1;
  int x_1;
  qreal offset_1;
  QSizeF s_1;
  QString str_1;
  qreal rad;
  int local_c0;
  int local_bc;
  int y;
  int x;
  qreal offset;
  QSizeF s;
  QString str;
  QFontMetricsF local_80 [4];
  int i;
  QFontMetricsF fm;
  QFont local_68 [8];
  QFont f;
  double local_58;
  qreal val;
  qreal cosa;
  qreal sina;
  qreal deltaRad;
  qreal fullStepsCount;
  int stepsCount;
  qreal startRad;
  DrawParams *params_local;
  QPainter *painter_local;
  MeterPrivate *this_local;
  
  if ((0.0 < this->scaleGridStep) && ((this->drawGridValues & 1U) != 0)) {
    QPainter::save();
    QPainter::translate(painter,(double)this->radius,(double)this->radius);
    QPainter::setPen((QColor *)painter);
    dVar4 = qDegreesToRadians((double)this->startScaleAngle);
    dVar4 = -dVar4;
    iVar3 = (int)((this->maxValue - this->minValue) / this->scaleGridStep);
    dVar10 = this->minValue;
    dVar11 = this->maxValue;
    dVar12 = this->scaleGridStep;
    dVar5 = qDegreesToRadians((params->scaleDegree / (this->maxValue - this->minValue)) *
                              this->scaleGridStep);
    local_58 = this->minValue;
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont(local_68,pQVar2);
    QFont::setPixelSize((int)local_68);
    QPainter::setFont((QFont *)painter);
    QFontMetricsF::QFontMetricsF(local_80,local_68);
    for (str.d.size._4_4_ = 0; str.d.size._4_4_ <= iVar3; str.d.size._4_4_ = str.d.size._4_4_ + 1) {
      dVar6 = qSin<double>((double)str.d.size._4_4_ * -dVar5 + dVar4);
      dVar15 = dVar4;
      dVar7 = qCos<double>((double)str.d.size._4_4_ * -dVar5 + dVar4);
      QString::number(local_58,(char)&s + '\b',0x66);
      offset = (qreal)QFontMetricsF::size((int)local_80,(QString *)0x100,(int)&s + 8,(int *)0x0);
      s.wd = dVar15;
      dVar8 = ((double)this->radius - params->gridLabelSize) + params->margin * -3.0;
      _y = dVar8;
      qVar9 = QSizeF::width((QSizeF *)&offset);
      dVar15 = _y;
      local_bc = (int)(dVar8 * dVar6 + qVar9 * -0.5);
      qVar9 = QSizeF::height((QSizeF *)&offset);
      local_c0 = (int)(dVar15 * dVar7 + qVar9 * 0.25);
      QPainter::drawText(painter,local_bc,local_c0,(QString *)&s.ht);
      local_58 = this->scaleGridStep + local_58;
      QString::~QString((QString *)&s.ht);
    }
    rad = (dVar11 - dVar10) / dVar12 - (double)iVar3;
    dVar10 = qAbs<double>(&rad);
    if (1e-06 < dVar10) {
      dVar10 = qDegreesToRadians(params->startScaleAngle + params->scaleDegree);
      uVar14 = 0;
      uVar16 = 0x80000000;
      dVar11 = qSin<double>(-dVar10);
      dVar10 = qCos<double>(-dVar10);
      QString::number(this->maxValue,(char)&s_1 + '\b',0x66);
      offset_1 = (qreal)QFontMetricsF::size((int)local_80,(QString *)0x100,(int)&s_1 + 8,(int *)0x0)
      ;
      s_1.wd = (qreal)CONCAT44(uVar16,uVar14);
      dVar12 = ((double)this->radius - params->gridLabelSize) + params->margin * -3.0;
      qVar9 = QSizeF::width((QSizeF *)&offset_1);
      qVar13 = QSizeF::height((QSizeF *)&offset_1);
      QPainter::drawText(painter,(int)(dVar12 * dVar11 + qVar9 * -0.5),
                         (int)(dVar12 * dVar10 + qVar13 * 0.25),(QString *)&s_1.ht);
      QString::~QString((QString *)&s_1.ht);
    }
    QPainter::restore();
    QFontMetricsF::~QFontMetricsF(local_80);
    QFont::~QFont(local_68);
  }
  bVar1 = QString::isEmpty(&this->unitsLabel);
  if (!bVar1) {
    QPainter::save();
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont(local_118,pQVar2);
    QFont::setPixelSize((int)local_118);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    QRectF::QRectF(&local_138,0.0,params->margin * 3.0 + params->gridLabelSize * 3.0,
                   (double)(this->radius * 2),(double)this->radius);
    QFlags<Qt::AlignmentFlag>::QFlags(&local_154,AlignHCenter);
    QTextOption::QTextOption(local_150,(QFlags_conflict *)(ulong)local_154.i);
    QPainter::drawText((QRectF *)painter,(QString *)&local_138,(QTextOption *)&this->unitsLabel);
    QTextOption::~QTextOption(local_150);
    QPainter::restore();
    QFont::~QFont(local_118);
  }
  bVar1 = QString::isEmpty(&this->label);
  if (!bVar1) {
    QPainter::save();
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont(local_168,pQVar2);
    QFont::setPixelSize((int)local_168);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    dVar10 = (double)(this->radius * 2);
    QRectF::QRectF(&local_188,0.0,(dVar10 - params->margin * 3.0) - params->gridLabelSize * 3.0,
                   dVar10,(double)this->radius);
    QFlags<Qt::AlignmentFlag>::QFlags(&local_1a4,AlignHCenter);
    QTextOption::QTextOption(local_1a0,(QFlags_conflict *)(ulong)local_1a4.i);
    QPainter::drawText((QRectF *)painter,(QString *)&local_188,(QTextOption *)&this->label);
    QTextOption::~QTextOption(local_1a0);
    QPainter::restore();
    QFont::~QFont(local_168);
  }
  if ((this->drawValue & 1U) != 0) {
    QPainter::save();
    pQVar2 = (QFont *)QPainter::font();
    QFont::QFont(local_1b8,pQVar2);
    QFont::setPixelSize((int)local_1b8);
    QFont::setBold(local_1b8,true);
    QPainter::setFont((QFont *)painter);
    QPainter::setPen((QColor *)painter);
    dVar10 = (double)(this->radius * 2);
    QRectF::QRectF(&local_1d8,0.0,
                   (dVar10 - params->margin) - (params->gridLabelSize + params->gridLabelSize),
                   dVar10,(double)this->radius);
    QString::number(this->value,(char)&local_1f0,0x66);
    QFlags<Qt::AlignmentFlag>::QFlags(&local_20c,AlignHCenter);
    QTextOption::QTextOption(local_208,(QFlags_conflict *)(ulong)local_20c.i);
    QPainter::drawText((QRectF *)painter,(QString *)&local_1d8,(QTextOption *)&local_1f0);
    QTextOption::~QTextOption(local_208);
    QString::~QString(&local_1f0);
    QPainter::restore();
    QFont::~QFont(local_1b8);
  }
  return;
}

Assistant:

void
MeterPrivate::drawLabels( QPainter & painter, DrawParams & params )
{
	if( scaleGridStep > 0.0 && drawGridValues )
	{
		painter.save();
		painter.translate( radius, radius );
		painter.setPen( textColor );

		qreal startRad = - qDegreesToRadians( (qreal) startScaleAngle  );
		int stepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal fullStepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		qreal deltaRad = - qDegreesToRadians( params.scaleDegree /
			( maxValue - minValue ) * scaleGridStep );
		qreal sina, cosa;
		qreal val = minValue;

		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		QFontMetricsF fm( f );

		for ( int i = 0; i <= stepsCount; ++i )
		{
			sina = qSin( startRad + i * deltaRad );
			cosa = qCos( startRad + i * deltaRad );

			const QString str = QString::number( val, 'f', scalePrecision );

			const QSizeF s = fm.size( Qt::TextSingleLine, str );

			const qreal offset = ( radius - params.gridLabelSize - params.margin * 3 );

			const int x = ( offset * sina ) - ( s.width() / 2 );
			const int y = ( offset * cosa ) + ( s.height() / 4 );

			painter.drawText( x, y, str );

			val += scaleGridStep;
		}

		if( qAbs( fullStepsCount - stepsCount ) > 0.000001 )
		{
			const qreal rad = - qDegreesToRadians( params.startScaleAngle + params.scaleDegree );

			sina = qSin( rad );
			cosa = qCos( rad );

			const QString str = QString::number( maxValue, 'f', scalePrecision );

			const QSizeF s = fm.size( Qt::TextSingleLine, str );

			const qreal offset = ( radius - params.gridLabelSize - params.margin * 3 );

			const int x = ( offset * sina ) - ( s.width() / 2 );
			const int y = ( offset * cosa ) + ( s.height() / 4 );

			painter.drawText( x, y, str );
		}

		painter.restore();
	}

	if( !unitsLabel.isEmpty() )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, params.margin * 3 + params.gridLabelSize * 3,
			radius * 2, radius ), unitsLabel, QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}

	if( !label.isEmpty() )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, radius * 2 - params.margin * 3 - params.gridLabelSize * 3,
			radius * 2, radius ), label, QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}

	if( drawValue )
	{
		painter.save();
		QFont f = painter.font();
		f.setPixelSize( params.fontPixelSize * 2 );
		f.setBold( true );
		painter.setFont( f );
		painter.setPen( textColor );
		painter.drawText( QRectF( 0, radius * 2 - params.margin - params.gridLabelSize * 2,
			radius * 2, radius ), QString::number( value, 'f', valuePrecision ),
			QTextOption( Qt::AlignHCenter ) );
		painter.restore();
	}
}